

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_emit.cc
# Opt level: O1

void __thiscall re2c::CpgotoTable::emit(CpgotoTable *this,OutputFile *o,uint32_t ind)

{
  uint32_t uVar1;
  uint32_t uVar2;
  OutputFile *pOVar3;
  opt_t *poVar4;
  long lVar5;
  long lVar6;
  string local_70;
  ulong local_50;
  long local_48;
  long local_40;
  realopt_t *local_38;
  
  pOVar3 = OutputFile::wind(o,ind);
  pOVar3 = OutputFile::ws(pOVar3,"static void *");
  local_38 = (realopt_t *)&DAT_0015d868;
  poVar4 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
  pOVar3 = OutputFile::wstring(pOVar3,&poVar4->yytarget);
  OutputFile::ws(pOVar3,"[256] = {\n");
  local_50 = (ulong)ind;
  OutputFile::wind(o,ind + 1);
  local_70._M_dataplus._M_p._0_4_ = max_label(this);
  uVar1 = label_t::width((label_t *)&local_70);
  lVar5 = 0x100;
  local_40 = 0xff;
  lVar6 = 0;
  local_48 = lVar5;
  do {
    pOVar3 = OutputFile::ws(o,"&&");
    poVar4 = realopt_t::operator->(local_38);
    pOVar3 = OutputFile::wstring(pOVar3,&poVar4->labelPrefix);
    OutputFile::wlabel(pOVar3,(label_t)(this->table[lVar6]->label).value);
    if (local_40 == lVar6) {
      OutputFile::ws(o,"\n");
    }
    else if ((~(uint)lVar6 & 7) == 0) {
      pOVar3 = OutputFile::ws(o,",\n");
      OutputFile::wind(pOVar3,ind + 1);
    }
    else {
      uVar2 = label_t::width(&this->table[lVar6]->label);
      pOVar3 = OutputFile::ws(o,",");
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_70,((char)uVar1 + '\x01') - (char)uVar2);
      OutputFile::wstring(pOVar3,&local_70);
      lVar5 = local_48;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        lVar5 = local_48;
      }
    }
    lVar6 = lVar6 + 1;
  } while (lVar5 != lVar6);
  pOVar3 = OutputFile::wind(o,(uint32_t)local_50);
  OutputFile::ws(pOVar3,"};\n");
  return;
}

Assistant:

void CpgotoTable::emit (OutputFile & o, uint32_t ind)
{
	o.wind(ind).ws("static void *").wstring(opts->yytarget).ws("[256] = {\n");
	o.wind(++ind);
	const uint32_t max_digits = max_label ().width ();
	for (uint32_t i = 0; i < TABLE_SIZE; ++i)
	{
		o.ws("&&").wstring(opts->labelPrefix).wlabel(table[i]->label);
		if (i == TABLE_SIZE - 1)
		{
			o.ws("\n");
		}
		else if (i % 8 == 7)
		{
			o.ws(",\n").wind(ind);
		}
		else
		{
			const uint32_t padding = max_digits - table[i]->label.width () + 1;
			o.ws(",").wstring(std::string (padding, ' '));
		}
	}
	o.wind(--ind).ws("};\n");
}